

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int PHF::init<unsigned_int,false>(phf *phf,uint *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  uint k_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  size_t __nmemb;
  size_t sVar10;
  uint *__base;
  int *piVar11;
  uint32_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  size_t __nmemb_00;
  ulong uVar20;
  uint *puVar21;
  long lVar22;
  size_t sVar23;
  uint *puVar24;
  uint *puVar25;
  uint *puVar26;
  bool bVar27;
  void *local_50;
  void *local_40;
  
  __nmemb_00 = n + (n == 0);
  uVar14 = l + (l == 0);
  sVar10 = 100;
  if (a < 100) {
    sVar10 = a;
  }
  phf->nodiv = false;
  __nmemb = phf_primeup(((__nmemb_00 + uVar14) - 1) / uVar14);
  sVar10 = phf_primeup((__nmemb_00 * 100) / (sVar10 + (sVar10 == 0)));
  if (sVar10 == 0 || __nmemb == 0) {
    iVar19 = 0x22;
  }
  else {
    __base = (uint *)calloc(__nmemb_00,0x10);
    if ((__base == (uint *)0x0) || (local_50 = calloc(__nmemb,8), local_50 == (void *)0x0)) {
      local_40 = (void *)0x0;
      local_50 = (void *)0x0;
    }
    else {
      lVar22 = 0;
      sVar23 = n;
      while (bVar27 = sVar23 != 0, sVar23 = sVar23 - 1, bVar27) {
        k_00 = *(uint *)((long)k + lVar22);
        uVar8 = phf_g<unsigned_int>(k_00,seed);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = __nmemb;
        lVar15 = SUB168(ZEXT416(uVar8) % auVar3,0);
        __base[lVar22] = k_00;
        __base[lVar22 + 1] = SUB164(ZEXT416(uVar8) % auVar3,0);
        *(void **)(__base + lVar22 + 2) = (void *)((long)local_50 + lVar15 * 8);
        plVar1 = (long *)((long)local_50 + lVar15 * 8);
        *plVar1 = *plVar1 + 1;
        lVar22 = lVar22 + 4;
      }
      qsort(__base,__nmemb_00,0x10,phf_keycmp<unsigned_int>);
      uVar14 = sVar10 + 0x3f >> 6;
      local_40 = calloc(uVar14 * 2,8);
      if (local_40 == (void *)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        puVar12 = (uint32_t *)calloc(__nmemb,4);
        if (puVar12 != (uint32_t *)0x0) {
          uVar16 = 0;
          puVar24 = __base;
LAB_001286a3:
          uVar16 = uVar16 & 0xffffffff;
          if ((puVar24 < __base + n * 4) && (**(long **)(puVar24 + 2) != 0)) {
            puVar21 = puVar24 + **(long **)(puVar24 + 2) * 4;
            uVar20 = 0;
            do {
              uVar20 = uVar20 + 1;
              puVar25 = puVar24;
              while( true ) {
                uVar8 = (uint32_t)uVar20;
                puVar26 = puVar24;
                if (puVar21 <= puVar25) goto LAB_00128765;
                uVar9 = phf_f<unsigned_int>(uVar8,*puVar25,seed);
                auVar4._8_8_ = 0;
                auVar4._0_8_ = sVar10;
                uVar17 = SUB168(ZEXT416(uVar9) % auVar4,0);
                uVar13 = uVar17 >> 6 & 0x3ffffff;
                uVar18 = 1L << (SUB161(ZEXT416(uVar9) % auVar4,0) & 0x3f);
                if (((*(ulong *)((long)local_40 + uVar13 * 8) >> (uVar17 & 0x3f) & 1) != 0) ||
                   (uVar17 = *(ulong *)((long)local_40 + uVar13 * 8 + uVar14 * 8),
                   (uVar17 & uVar18) != 0)) break;
                *(ulong *)((long)local_40 + uVar13 * 8 + uVar14 * 8) = uVar17 | uVar18;
                puVar25 = puVar25 + 4;
              }
              for (; puVar26 < puVar21; puVar26 = puVar26 + 4) {
                uVar9 = phf_f<unsigned_int>(uVar8,*puVar26,seed);
                auVar5._8_8_ = 0;
                auVar5._0_8_ = sVar10;
                bVar7 = SUB161(ZEXT416(uVar9) % auVar5,0) & 0x3f;
                puVar2 = (ulong *)((long)local_40 +
                                  (SUB168(ZEXT416(uVar9) % auVar5,0) >> 6 & 0x3ffffff) * 8 +
                                  uVar14 * 8);
                *puVar2 = *puVar2 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
            } while( true );
          }
          phf->seed = seed;
          phf->r = __nmemb;
          phf->m = sVar10;
          phf->g = puVar12;
          phf->d_max = uVar16;
          phf->g_op = PHF_G_UINT32_MOD_R;
          phf->g_jmp = (void *)0x0;
          iVar19 = 0;
          goto LAB_00128603;
        }
      }
    }
    piVar11 = __errno_location();
    iVar19 = *piVar11;
LAB_00128603:
    free(local_40);
    free(local_50);
    free(__base);
  }
  return iVar19;
LAB_00128765:
  for (; puVar26 < puVar21; puVar26 = puVar26 + 4) {
    uVar9 = phf_f<unsigned_int>(uVar8,*puVar26,seed);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = sVar10;
    puVar2 = (ulong *)((long)local_40 + (SUB168(ZEXT416(uVar9) % auVar6,0) >> 6 & 0x3ffffff) * 8);
    *puVar2 = *puVar2 | 1L << (SUB161(ZEXT416(uVar9) % auVar6,0) & 0x3f);
  }
  puVar12[puVar24[1]] = uVar8;
  puVar24 = puVar21;
  if (uVar16 < uVar20) {
    uVar16 = uVar20;
  }
  goto LAB_001286a3;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}